

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O2

int fs(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  int iVar2;
  double *returnvalue;
  double *returnvalue_00;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  
  lVar6 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x20);
  dVar8 = *(double *)((long)user_data + 8);
  returnvalue = (double *)N_VGetArrayPointer();
  iVar2 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar5 = 1;
  if (iVar2 == 0) {
    returnvalue_00 = (double *)N_VGetArrayPointer(ydot);
    iVar2 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar2 == 0) {
      dVar8 = -dVar1 / dVar8;
      if (dVar1 <= -dVar1) {
        if (dVar1 < 0.0) {
          lVar6 = lVar6 + -1;
          lVar4 = 0;
          lVar3 = 0;
          if (0 < lVar6) {
            lVar3 = lVar6;
          }
          while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
            *(double *)((long)returnvalue_00 + lVar4) =
                 (*(double *)((long)returnvalue + lVar4 + 0x18) -
                 *(double *)((long)returnvalue + lVar4)) * dVar8;
            *(double *)((long)returnvalue_00 + lVar4 + 8) =
                 (*(double *)((long)returnvalue + lVar4 + 0x20) -
                 *(double *)((long)returnvalue + lVar4 + 8)) * dVar8;
            *(double *)((long)returnvalue_00 + lVar4 + 0x10) =
                 (*(double *)((long)returnvalue + lVar4 + 0x28) -
                 *(double *)((long)returnvalue + lVar4 + 0x10)) * dVar8;
            lVar4 = lVar4 + 0x18;
          }
          returnvalue_00[lVar6 * 3] = (returnvalue[lVar6 * 3] - *returnvalue) * dVar8;
          returnvalue_00[lVar6 * 3 + 1] = (returnvalue[lVar6 * 3 + 1] - returnvalue[1]) * dVar8;
          returnvalue_00[lVar6 * 3 + 2] = (returnvalue[lVar6 * 3 + 2] - returnvalue[2]) * dVar8;
        }
      }
      else {
        *returnvalue_00 = (*returnvalue - returnvalue[lVar6 * 3 + -3]) * dVar8;
        returnvalue_00[1] = (returnvalue[1] - returnvalue[lVar6 * 3 + -2]) * dVar8;
        returnvalue_00[2] = (returnvalue[2] - returnvalue[lVar6 * 3 + -1]) * dVar8;
        lVar4 = 0x18;
        for (lVar3 = 1; lVar3 < lVar6; lVar3 = lVar3 + 1) {
          *(double *)((long)returnvalue_00 + lVar4) =
               (*(double *)((long)returnvalue + lVar4) -
               *(double *)((long)returnvalue + lVar4 + -0x18)) * dVar8;
          *(double *)((long)returnvalue_00 + lVar4 + 8) =
               (*(double *)((long)returnvalue + lVar4 + 8) -
               *(double *)((long)returnvalue + lVar4 + -0x10)) * dVar8;
          *(double *)((long)returnvalue_00 + lVar4 + 0x10) =
               (*(double *)((long)returnvalue + lVar4 + 0x10) -
               *(double *)((long)returnvalue + lVar4 + -8)) * dVar8;
          lVar4 = lVar4 + 0x18;
        }
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int fs(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata      = (UserData)user_data; /* access problem data    */
  sunindextype N      = udata->N;            /* set variable shortcuts */
  sunrealtype c       = udata->c;
  sunrealtype dx      = udata->dx;
  sunrealtype* Ydata  = NULL;
  sunrealtype* dYdata = NULL;
  sunrealtype tmp;
  sunindextype i;

  /* access data arrays */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over domain, computing advection */
  tmp = -c / dx;

  if (c > ZERO)
  {
    /*
     * right moving flow
     */

    /* left boundary Jacobian entries */
    dYdata[IDX(0, 0)] = tmp * (Ydata[IDX(0, 0)] - Ydata[IDX(N - 1, 0)]);
    dYdata[IDX(0, 1)] = tmp * (Ydata[IDX(0, 1)] - Ydata[IDX(N - 1, 1)]);
    dYdata[IDX(0, 2)] = tmp * (Ydata[IDX(0, 2)] - Ydata[IDX(N - 1, 2)]);

    /* interior Jacobian entries */
    for (i = 1; i < N; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i, 0)] - Ydata[IDX(i - 1, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i, 1)] - Ydata[IDX(i - 1, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i, 2)] - Ydata[IDX(i - 1, 2)]);
    }
  }
  else if (c < ZERO)
  {
    /*
     * left moving flow
     */

    /* interior Jacobian entries */
    for (i = 0; i < N - 1; i++)
    {
      dYdata[IDX(i, 0)] = tmp * (Ydata[IDX(i + 1, 0)] - Ydata[IDX(i, 0)]);
      dYdata[IDX(i, 1)] = tmp * (Ydata[IDX(i + 1, 1)] - Ydata[IDX(i, 1)]);
      dYdata[IDX(i, 2)] = tmp * (Ydata[IDX(i + 1, 2)] - Ydata[IDX(i, 2)]);
    }

    /* right boundary Jacobian entries */
    dYdata[IDX(N - 1, 0)] = tmp * (Ydata[IDX(N - 1, 0)] - Ydata[IDX(0, 0)]);
    dYdata[IDX(N - 1, 1)] = tmp * (Ydata[IDX(N - 1, 1)] - Ydata[IDX(0, 1)]);
    dYdata[IDX(N - 1, 2)] = tmp * (Ydata[IDX(N - 1, 2)] - Ydata[IDX(0, 2)]);
  }

  /* return success */
  return (0);
}